

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O3

void google::protobuf::json_internal::ParseProto3Type::SetBool(Field f,Msg *msg,bool x)

{
  byte *ptr;
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  char b;
  undefined1 local_19;
  
  RecordAsSeen(f,msg);
  uVar4 = (f->raw_->field_0)._impl_.number_ << 3;
  pbVar3 = (msg->stream_).cur_;
  if ((msg->stream_).impl_.end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar3);
  }
  uVar5 = uVar4;
  if (0x7f < uVar4) {
    do {
      *pbVar3 = (byte)uVar5 | 0x80;
      uVar4 = uVar5 >> 7;
      pbVar3 = pbVar3 + 1;
      bVar2 = 0x3fff < uVar5;
      uVar5 = uVar4;
    } while (bVar2);
  }
  ptr = pbVar3 + 1;
  *pbVar3 = (byte)uVar4;
  (msg->stream_).cur_ = ptr;
  pbVar1 = (msg->stream_).impl_.end_;
  if (pbVar1 == ptr || (long)pbVar1 - (long)ptr < 0) {
    local_19 = x;
    pbVar3 = io::EpsCopyOutputStream::WriteRawFallback((EpsCopyOutputStream *)msg,&local_19,1,ptr);
  }
  else {
    pbVar3[1] = x;
    pbVar3 = pbVar3 + 2;
  }
  (msg->stream_).cur_ = pbVar3;
  return;
}

Assistant:

static void SetBool(Field f, Msg& msg, bool x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3);
    char b = x ? 0x01 : 0x00;
    msg.stream_.WriteRaw(&b, 1);
  }